

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O2

int i2c_open(uint i2c_bus,uint i2c_addr,uint32_t i2c_flags)

{
  int iVar1;
  uint32_t i2c_flags_local;
  gpioExtent_t ext [1];
  
  ext[0].ptr = &i2c_flags_local;
  ext[0].size = 4;
  i2c_flags_local = i2c_flags;
  iVar1 = pigpio_command_ext(gPigCommand,0x36,i2c_bus,i2c_addr,4,1,ext,1);
  return iVar1;
}

Assistant:

int i2c_open(unsigned i2c_bus, unsigned i2c_addr, uint32_t i2c_flags)
{
   gpioExtent_t ext[1];

   /*
   p1=i2c_bus
   p2=i2c_addr
   p3=4
   ## extension ##
   uint32_t i2c_flags
   */

   ext[0].size = sizeof(uint32_t);
   ext[0].ptr = &i2c_flags;

   return pigpio_command_ext
      (gPigCommand, PI_CMD_I2CO, i2c_bus, i2c_addr, 4, 1, ext, 1);
}